

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool IR::Instr::OpndHasAnyImplicitCalls(Opnd *opnd,bool isSrc)

{
  bool bVar1;
  SymOpnd *pSVar2;
  ListOpnd *this;
  bool local_18;
  bool local_17;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_14;
  byte local_11;
  Opnd *pOStack_10;
  bool isSrc_local;
  Opnd *opnd_local;
  
  if (opnd == (Opnd *)0x0) {
    return false;
  }
  local_11 = isSrc;
  pOStack_10 = opnd;
  bVar1 = Opnd::IsSymOpnd(opnd);
  if (bVar1) {
    pSVar2 = Opnd::AsSymOpnd(pOStack_10);
    bVar1 = Sym::IsPropertySym(pSVar2->m_sym);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = Opnd::IsIndirOpnd(pOStack_10);
  local_17 = true;
  if (!bVar1) {
    if ((local_11 & 1) != 0) {
      local_14.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           Opnd::GetValueType(pOStack_10);
      bVar1 = ValueType::IsPrimitive((ValueType *)&local_14.field_0);
      if (!bVar1) {
        return true;
      }
    }
    bVar1 = Opnd::IsListOpnd(pOStack_10);
    local_18 = false;
    if (bVar1) {
      this = Opnd::AsListOpnd(pOStack_10);
      local_18 = ListOpnd::Any<IR::Instr::OpndHasAnyImplicitCalls(IR::Opnd*,bool)::__0>
                           (this,(anon_class_1_1_a8171f7a)(local_11 & 1));
    }
    local_17 = local_18;
  }
  return local_17;
}

Assistant:

bool Instr::OpndHasAnyImplicitCalls(IR::Opnd* opnd, bool isSrc)
{
    return opnd && (
        (opnd->IsSymOpnd() && opnd->AsSymOpnd()->m_sym->IsPropertySym()) ||
        opnd->IsIndirOpnd() ||
        (isSrc && !opnd->GetValueType().IsPrimitive()) ||
        (opnd->IsListOpnd() && opnd->AsListOpnd()->Any([isSrc](IR::Opnd* lOpnd) { return OpndHasAnyImplicitCalls(lOpnd, isSrc); }))
    );
}